

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O0

void __thiscall ProblemFireFighting::FillTransitionModel(ProblemFireFighting *this)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  const_iterator in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  Index fs2I;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *full_s2;
  double p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ja_vec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s1_vec_stripped;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s2_vec;
  Index s2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> s1_vec;
  Index s1;
  Index ja;
  undefined4 in_stack_fffffffffffffec8;
  Index in_stack_fffffffffffffecc;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_fffffffffffffed0;
  ProblemFireFighting *in_stack_fffffffffffffed8;
  iterator in_stack_fffffffffffffee0;
  allocator_type *__a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff00;
  reference in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff30;
  Index in_stack_ffffffffffffff34;
  iterator in_stack_ffffffffffffff38;
  iterator in_stack_ffffffffffffff40;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90 [3];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_71;
  undefined1 local_48 [56];
  uint local_10;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    __first._M_current = (uint *)(ulong)local_c;
    pvVar1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             (**(code **)((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI._M_current
                           )->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start + 0x1c))();
    if (pvVar1 <= __first._M_current) break;
    local_10 = 0;
    while( true ) {
      __last._M_current = (uint *)(ulong)local_10;
      pvVar1 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               (**(code **)((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             in_RDI._M_current)->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + 0xc))();
      if (pvVar1 <= __last._M_current) break;
      GetStateVector(in_stack_fffffffffffffed8,(Index)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      for (local_48._28_4_ = 0;
          (pointer)(ulong)(uint)local_48._28_4_ <
          (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)in_RDI._M_current + 600))
          ->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish; local_48._28_4_ = local_48._28_4_ + 1) {
        IndexTools::JointToIndividualIndices
                  ((Index)((ulong)in_stack_ffffffffffffff08 >> 0x20),in_stack_ffffffffffffff00);
        __a = (allocator_type *)(local_48 + 0x20);
        in_stack_ffffffffffffff00 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a,0);
        in_stack_ffffffffffffff08 =
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a,
                        (size_type)
                        (((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)in_RDI._M_current + 0x228))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
        pvVar1 = &local_71;
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x996d8c);
        std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
                  (pvVar1,in_stack_ffffffffffffff08,(uint *)in_stack_ffffffffffffff00,__a);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x996db7);
        (**(code **)((((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI._M_current)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start + 0x28))(in_RDI._M_current,local_c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__first._M_current,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__last._M_current);
        indices = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                  ComputeTransitionProb
                            ((ProblemFireFighting *)in_stack_ffffffffffffff40._M_current,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             in_stack_ffffffffffffff38._M_current,
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             in_RDI._M_current);
        if (0.0 < (double)indices) {
          in_stack_fffffffffffffed8 = (ProblemFireFighting *)local_48;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    (in_stack_fffffffffffffed0,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffed0 = local_90;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_ffffffffffffff40 =
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          in_stack_fffffffffffffee0 =
               std::vector<unsigned_int,std::allocator<unsigned_int>>::
               insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                         (pvVar1,in_RDI,__first,__last);
          in_stack_ffffffffffffff38 = in_stack_fffffffffffffee0;
          in_stack_fffffffffffffecc =
               IndexTools::IndividualToJointIndices
                         (indices,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  in_stack_fffffffffffffee0._M_current);
          in_stack_ffffffffffffff34 = in_stack_fffffffffffffecc;
          MultiAgentDecisionProcessDiscrete::SetTransitionProbability
                    ((MultiAgentDecisionProcessDiscrete *)in_stack_fffffffffffffee0._M_current,
                     (Index)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                     (Index)in_stack_fffffffffffffed8,
                     (Index)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                     (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_fffffffffffffee0._M_current);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_fffffffffffffee0._M_current);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   in_stack_fffffffffffffee0._M_current);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffee0._M_current);
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void ProblemFireFighting::FillTransitionModel()
{
    // add transitions:
    for(Index ja=0; ja<GetNrJointActions(); ja++)
        for(Index s1=0; s1<GetNrStates();s1++) 
        {
#if DEBUG_CTM
            cout << "Transitions from s1="<<s1<<endl;
#endif
            vector< Index > s1_vec = GetStateVector(s1);
/* skip check for matlab generation compatibility            
            size_t nrSPs1 = NumberOfContainedStartPositions(s1_vec);
            if(nrSPs1 > 0 && nrSPs1 != GetNrAgents())
            {
                //illegal state, the prob. is zero except for transition
                //to self:
                SetTransitionProbability(s1, ja, s1, 1.0);
                //else 0, but we do not need to add that
                continue;
            }
*/
            //Since movements are deterministic, we can simply fill out
            //the position elements of the state factor
            //therefore we only need to loop over joint-firelevel vectors 
            //here
            for(Index s2=0; s2<_m_nrJointFirelevels;s2++) 
            {
                vector< Index > s2_vec = IndexTools::JointToIndividualIndices
                    (s2, _m_nrFLs_vec);
                //no longer necessary since we fill in the position components
                //if(NumberOfContainedStartPositions(s2_vec) > 0)
                    //continue;

                vector< Index > s1_vec_stripped(&s1_vec[0], 
                        &s1_vec[_m_nrHouses] );
                vector< Index > ja_vec = JointToIndividualActionIndices(ja);
                double p = ComputeTransitionProb(s1_vec_stripped, 
                        ja_vec, s2_vec);
#if DEBUG_CTM
                cout << "Trans from s="
                    << SoftPrintVector(s1_vec) 
                    << ", a=" 
                    << SoftPrintVector(ja_vec) 
                    << " to s'="
                    << SoftPrintVector(s2_vec) 
                    << " Prob=" << p << endl;
#endif
                if(p > 0.0)
                {
                    //compute full s2 index
                    vector< Index >& full_s2 = s2_vec;
                    full_s2.insert(full_s2.end(), ja_vec.begin(), ja_vec.end());
                    Index fs2I = IndexTools::IndividualToJointIndices(full_s2, 
                            _m_nrPerStateFeatureVec);
                    SetTransitionProbability(s1, ja, fs2I, p);
                }
            }
        }
}